

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O1

int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  MinRegMan_t *pMVar2;
  int iVar3;
  undefined8 *__ptr;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  Abc_Ntk_t *pAVar6;
  undefined8 uVar7;
  long lVar8;
  uint uVar9;
  char *__s;
  int iVar10;
  
  __ptr = (undefined8 *)malloc(0x10);
  *__ptr = 0;
  __ptr[1] = 0;
  pMVar2 = pManMR;
  if (pManMR->pInitNtk == (Abc_Ntk_t *)0x0) {
    __assert_fail("pManMR->pInitNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x22f,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
  }
  if (pManMR->fSolutionIsDc == 0) {
    pVVar5 = pManMR->pInitNtk->vObjs;
    lVar4 = (long)pVVar5->nSize;
    if (0 < lVar4) {
      lVar8 = 0;
      do {
        pvVar1 = pVVar5->pArray[lVar8];
        if (pvVar1 != (void *)0x0) {
          uVar9 = *(uint *)((long)pvVar1 + 0x14) & 0xf;
          if (uVar9 == 4) {
            __assert_fail("!Abc_ObjIsBi(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                          ,0x23d,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
          }
          if (uVar9 == 5) {
            __assert_fail("!Abc_ObjIsBo(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                          ,0x23c,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
          }
          if (uVar9 == 8) {
            __assert_fail("!Abc_ObjIsLatch(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                          ,0x23b,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar4 != lVar8);
    }
    if (*(int *)((long)__ptr + 4) != 0) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
    }
    free(__ptr);
    Abc_NtkAddDummyPoNames(pManMR->pInitNtk);
    Abc_NtkAddDummyPiNames(pManMR->pInitNtk);
    if (pManMR->pInitNtk->ntkType == ABC_NTK_LOGIC) {
      Abc_NtkCleanup(pManMR->pInitNtk,0);
    }
    if (pManMR->fVerbose != 0) {
      printf("\tsolving for init state (%d nodes)... ",(ulong)(uint)pManMR->pInitNtk->nObjs);
    }
    fflush(_stdout);
    if (pManMR->pInitNtk->ntkFunc == ABC_FUNC_SOP) {
      Abc_NtkSopToBdd(pManMR->pInitNtk);
    }
    if (pManMR->pInitNtk->ntkFunc == ABC_FUNC_AIG) {
      Abc_NtkAigToBdd(pManMR->pInitNtk);
    }
    iVar10 = 0;
    iVar3 = Abc_NtkMiterSat(pManMR->pInitNtk,500000,50000000,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0
                           );
    if (iVar3 == 0) {
      if (pManMR->fVerbose != 0) {
        puts("SUCCESS");
      }
      pMVar2 = pManMR;
      pVVar5 = pManMR->pInitNtk->vPis;
      if (0 < pVVar5->nSize) {
        lVar4 = 0;
        do {
          *(undefined8 *)((long)pVVar5->pArray[lVar4] + 0x40) = 0;
          lVar4 = lVar4 + 1;
          pVVar5 = pMVar2->pInitNtk->vPis;
        } while (lVar4 < pVVar5->nSize);
      }
      pVVar5 = pNtk->vBoxes;
      if (0 < pVVar5->nSize) {
        lVar4 = 0;
        do {
          pvVar1 = pVVar5->pArray[lVar4];
          if ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 8) {
            if ((*(uint *)(*(long *)((long)pvVar1 + 0x38) + 0x14) & 0xf) != 2) {
              __assert_fail("Abc_ObjIsPi( pInitObj )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                            ,0x272,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
            }
            *(void **)(*(long *)((long)pvVar1 + 0x38) + 0x40) = pvVar1;
            if ((*(uint *)((long)pvVar1 + 0x14) & 0xf) != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x1a3,"void Abc_LatchSetInitNone(Abc_Obj_t *)");
            }
            *(undefined8 *)((long)pvVar1 + 0x38) = 0;
          }
          lVar4 = lVar4 + 1;
          pVVar5 = pNtk->vBoxes;
        } while (lVar4 < pVVar5->nSize);
      }
      if (pMVar2->pInitNtk->pModel == (int *)0x0) {
        __assert_fail("pManMR->pInitNtk->pModel",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x27b,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
      }
      pAVar6 = pMVar2->pInitNtk;
      pVVar5 = pAVar6->vPis;
      if (0 < pVVar5->nSize) {
        lVar4 = 0;
        do {
          lVar8 = *(long *)((long)pVVar5->pArray[lVar4] + 0x40);
          if (lVar8 != 0) {
            uVar9 = *(uint *)(lVar8 + 0x14) & 0xf;
            if (pAVar6->pModel[lVar4] == 0) {
              uVar7 = 1;
              if (uVar9 != 8) {
                __assert_fail("Abc_ObjIsLatch(pLatch)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                              ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
              }
            }
            else {
              uVar7 = 2;
              if (uVar9 != 8) {
                __assert_fail("Abc_ObjIsLatch(pLatch)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                              ,0x1a5,"void Abc_LatchSetInit1(Abc_Obj_t *)");
              }
            }
            *(undefined8 *)(lVar8 + 0x38) = uVar7;
          }
          lVar4 = lVar4 + 1;
          pAVar6 = pMVar2->pInitNtk;
          pVVar5 = pAVar6->vPis;
        } while (lVar4 < pVVar5->nSize);
      }
      lVar4 = (long)pNtk->vBoxes->nSize;
      if (lVar4 < 1) {
        return 1;
      }
      lVar8 = 0;
      while ((pvVar1 = pNtk->vBoxes->pArray[lVar8], (*(uint *)((long)pvVar1 + 0x14) & 0xf) != 8 ||
             (*(long *)((long)pvVar1 + 0x38) != 0))) {
        lVar8 = lVar8 + 1;
        if (lVar4 == lVar8) {
          return 1;
        }
      }
      __assert_fail("!Abc_LatchIsInitNone( pObj )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x287,"int Abc_FlowRetime_SolveBackwardInit(Abc_Ntk_t *)");
    }
    if (pManMR->fVerbose == 0) {
      return 0;
    }
    __s = "FAILURE";
  }
  else {
    free(__ptr);
    pVVar5 = pNtk->vBoxes;
    if (0 < pVVar5->nSize) {
      lVar4 = 0;
      do {
        if ((*(uint *)((long)pVVar5->pArray[lVar4] + 0x14) & 0xf) == 8) {
          *(undefined8 *)((long)pVVar5->pArray[lVar4] + 0x38) = 3;
        }
        lVar4 = lVar4 + 1;
        pVVar5 = pNtk->vBoxes;
      } while (lVar4 < pVVar5->nSize);
    }
    iVar10 = 1;
    if (pMVar2->fVerbose == 0) {
      return 1;
    }
    __s = "\tno init state computation: all-don\'t-care solution";
  }
  puts(__s);
  return iVar10;
}

Assistant:

int Abc_FlowRetime_SolveBackwardInit( Abc_Ntk_t * pNtk ) {
  int i;
  Abc_Obj_t *pObj, *pInitObj;
  Vec_Ptr_t *vDelete = Vec_PtrAlloc(0);
  Abc_Ntk_t *pSatNtk;
  int result;

  assert(pManMR->pInitNtk);

  // is the solution entirely DC's?
  if (pManMR->fSolutionIsDc) {
    Vec_PtrFree(vDelete);
    Abc_NtkForEachLatch( pNtk, pObj, i ) Abc_LatchSetInitDc( pObj );
    vprintf("\tno init state computation: all-don't-care solution\n");
    return 1;
  }

  // check that network is combinational
  Abc_NtkForEachObj( pManMR->pInitNtk, pObj, i ) {
    assert(!Abc_ObjIsLatch(pObj));
    assert(!Abc_ObjIsBo(pObj));
    assert(!Abc_ObjIsBi(pObj));
  }
  
  // delete superfluous nodes
  while(Vec_PtrSize( vDelete )) {
    pObj = (Abc_Obj_t *)Vec_PtrPop( vDelete );
    Abc_NtkDeleteObj( pObj );
  }
  Vec_PtrFree(vDelete);

  // do some final cleanup on the network
  Abc_NtkAddDummyPoNames(pManMR->pInitNtk);
  Abc_NtkAddDummyPiNames(pManMR->pInitNtk);
  if (Abc_NtkIsLogic(pManMR->pInitNtk))
    Abc_NtkCleanup(pManMR->pInitNtk, 0);

#if defined(DEBUG_PRINT_INIT_NTK)
  Abc_NtkLevelReverse( pManMR->pInitNtk );
  Abc_NtkForEachObj( pManMR->pInitNtk, pObj, i ) 
    if (Abc_ObjLevel( pObj ) < 2)
      Abc_ObjPrint(stdout, pObj);
#endif
  
  vprintf("\tsolving for init state (%d nodes)... ", Abc_NtkObjNum(pManMR->pInitNtk));
  fflush(stdout);
#ifdef ABC_USE_CUDD
  // convert SOPs to BDD
  if (Abc_NtkHasSop(pManMR->pInitNtk))
    Abc_NtkSopToBdd( pManMR->pInitNtk );
  // convert AIGs to BDD
  if (Abc_NtkHasAig(pManMR->pInitNtk))
    Abc_NtkAigToBdd( pManMR->pInitNtk );
#else
  // convert SOPs to AIG
  if (Abc_NtkHasSop(pManMR->pInitNtk))
    Abc_NtkSopToAig( pManMR->pInitNtk );
#endif
  pSatNtk = pManMR->pInitNtk;
  
  // solve
  result = Abc_NtkMiterSat( pSatNtk, (ABC_INT64_T)500000, (ABC_INT64_T)50000000, 0, NULL, NULL );

  if (!result) { 
    vprintf("SUCCESS\n");
  } else  {    
    vprintf("FAILURE\n");
    return 0;
  }

  // clear initial values, associate PIs to latches
  Abc_NtkForEachPi( pManMR->pInitNtk, pInitObj, i ) Abc_ObjSetCopy( pInitObj, NULL );
  Abc_NtkForEachLatch( pNtk, pObj, i ) {
    pInitObj = (Abc_Obj_t*)Abc_ObjData( pObj );
    assert( Abc_ObjIsPi( pInitObj ));
    Abc_ObjSetCopy( pInitObj, pObj );
    Abc_LatchSetInitNone( pObj );

    // DEBUG
    // printf("solve : getting latch %d from PI %d\n", pObj->Id, pInitObj->Id);
  }

  // copy solution from PIs to latches
  assert(pManMR->pInitNtk->pModel);
  Abc_NtkForEachPi( pManMR->pInitNtk, pInitObj, i ) {
    if ((pObj = Abc_ObjCopy( pInitObj ))) {
      if ( pManMR->pInitNtk->pModel[i] )
        Abc_LatchSetInit1( pObj );
      else
        Abc_LatchSetInit0( pObj );
    }
  }

#if defined(DEBUG_CHECK)
  // check that all latches have initial state
  Abc_NtkForEachLatch( pNtk, pObj, i ) assert( !Abc_LatchIsInitNone( pObj ) );
#endif

  return 1;
}